

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

char * mp_decode_bin(char **data,uint32_t *len)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  
  if (len == (uint32_t *)0x0) {
    __assert_fail("len != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                  ,0x83d,"const char *mp_decode_bin(const char **, uint32_t *)");
  }
  pcVar2 = *data;
  cVar1 = *pcVar2;
  *data = pcVar2 + 1;
  if (cVar1 == -0x3a) {
    uVar4 = *(uint *)(pcVar2 + 1);
    uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    pcVar3 = pcVar2 + 5;
  }
  else if (cVar1 == -0x3b) {
    pcVar3 = pcVar2 + 3;
    uVar4 = (uint)(ushort)(*(ushort *)(pcVar2 + 1) << 8 | *(ushort *)(pcVar2 + 1) >> 8);
  }
  else {
    if (cVar1 != -0x3c) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/third_party/msgpuck/msgpuck.h"
                    ,0x836,"uint32_t mp_decode_binl(const char **)");
    }
    uVar4 = (uint)(byte)pcVar2[1];
    pcVar3 = pcVar2 + 2;
  }
  *len = uVar4;
  *data = pcVar3 + uVar4;
  return pcVar3;
}

Assistant:

MP_IMPL const char *
mp_decode_bin(const char **data, uint32_t *len)
{
	assert(len != NULL);

	*len = mp_decode_binl(data);
	const char *str = *data;
	*data += *len;
	return str;
}